

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O1

Result<wasm::Ok> * __thiscall
wasm::WATParser::parseModule
          (Result<wasm::Ok> *__return_storage_ptr__,WATParser *this,Module *wasm,string_view in,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *filename)

{
  long *plVar1;
  bool bVar2;
  string_view buffer;
  undefined1 local_b0 [8];
  Lexer lexer;
  long local_48 [2];
  char local_38;
  
  plVar1 = (long *)in._M_str;
  local_38 = 0;
  bVar2 = (char)plVar1[4] == '\x01';
  if (bVar2) {
    lexer.buffer._M_str = (char *)local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&lexer.buffer._M_str,*plVar1,plVar1[1] + *plVar1);
  }
  buffer._M_str = (char *)in._M_len;
  buffer._M_len = (size_t)wasm;
  local_38 = bVar2;
  Lexer::Lexer((Lexer *)local_b0,buffer,
               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&lexer.buffer._M_str);
  if (local_38 == '\x01') {
    local_38 = '\0';
    if ((long *)lexer.buffer._M_str != local_48) {
      operator_delete(lexer.buffer._M_str,local_48[0] + 1);
    }
  }
  anon_unknown_12::doParseModule(__return_storage_ptr__,(Module *)this,(Lexer *)local_b0,false);
  if (lexer.file.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._24_1_ == '\x01') {
    lexer.file.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_1_ = 0;
    if (lexer.annotations.
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage !=
        (pointer)((long)&lexer.file.
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload + 8U)) {
      operator_delete(lexer.annotations.
                      super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      lexer.file.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._M_value._M_string_length + 1);
    }
  }
  if (lexer.pos != 0) {
    operator_delete((void *)lexer.pos,
                    (long)lexer.annotations.
                          super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                          ._M_impl.super__Vector_impl_data._M_finish - lexer.pos);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> parseModule(Module& wasm,
                     std::string_view in,
                     std::optional<std::string> filename) {
  Lexer lexer(in, filename);
  return doParseModule(wasm, lexer, false);
}